

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGParseGrammarContent(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr nodes)

{
  int iVar1;
  int local_24;
  int tmp;
  int ret;
  xmlNodePtr nodes_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  local_24 = 0;
  _tmp = nodes;
  if (nodes == (xmlNodePtr)0x0) {
    xmlRngPErr(ctxt,(xmlNodePtr)0x0,0x40d,"grammar has no children\n",(xmlChar *)0x0,(xmlChar *)0x0)
    ;
    ctxt_local._4_4_ = -1;
  }
  else {
    for (; _tmp != (xmlNodePtr)0x0; _tmp = _tmp->next) {
      if ((((_tmp == (xmlNodePtr)0x0) || (_tmp->ns == (xmlNs *)0x0)) ||
          (_tmp->type != XML_ELEMENT_NODE)) ||
         ((iVar1 = xmlStrEqual(_tmp->name,(xmlChar *)"start"), iVar1 == 0 ||
          (iVar1 = xmlStrEqual(_tmp->ns->href,xmlRelaxNGNs), iVar1 == 0)))) {
        if (((_tmp == (xmlNodePtr)0x0) ||
            ((_tmp->ns == (xmlNs *)0x0 || (_tmp->type != XML_ELEMENT_NODE)))) ||
           ((iVar1 = xmlStrEqual(_tmp->name,"define"), iVar1 == 0 ||
            (iVar1 = xmlStrEqual(_tmp->ns->href,xmlRelaxNGNs), iVar1 == 0)))) {
          if ((((_tmp == (xmlNodePtr)0x0) || (_tmp->ns == (xmlNs *)0x0)) ||
              (_tmp->type != XML_ELEMENT_NODE)) ||
             ((iVar1 = xmlStrEqual(_tmp->name,(xmlChar *)"include"), iVar1 == 0 ||
              (iVar1 = xmlStrEqual(_tmp->ns->href,xmlRelaxNGNs), iVar1 == 0)))) {
            xmlRngPErr(ctxt,_tmp,0x40c,"grammar has unexpected child %s\n",_tmp->name,(xmlChar *)0x0
                      );
            local_24 = -1;
          }
          else {
            iVar1 = xmlRelaxNGParseInclude(ctxt,_tmp);
            if (iVar1 != 0) {
              local_24 = -1;
            }
          }
        }
        else {
          iVar1 = xmlRelaxNGParseDefine(ctxt,_tmp);
          if (iVar1 != 0) {
            local_24 = -1;
          }
        }
      }
      else if (_tmp->children == (_xmlNode *)0x0) {
        xmlRngPErr(ctxt,_tmp,0x452,"start has no children\n",(xmlChar *)0x0,(xmlChar *)0x0);
      }
      else {
        iVar1 = xmlRelaxNGParseStart(ctxt,_tmp->children);
        if (iVar1 != 0) {
          local_24 = -1;
        }
      }
    }
    ctxt_local._4_4_ = local_24;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGParseGrammarContent(xmlRelaxNGParserCtxtPtr ctxt,
                              xmlNodePtr nodes)
{
    int ret = 0, tmp;

    if (nodes == NULL) {
        xmlRngPErr(ctxt, nodes, XML_RNGP_GRAMMAR_EMPTY,
                   "grammar has no children\n", NULL, NULL);
        return (-1);
    }
    while (nodes != NULL) {
        if (IS_RELAXNG(nodes, "start")) {
            if (nodes->children == NULL) {
                xmlRngPErr(ctxt, nodes, XML_RNGP_START_EMPTY,
                           "start has no children\n", NULL, NULL);
            } else {
                tmp = xmlRelaxNGParseStart(ctxt, nodes->children);
                if (tmp != 0)
                    ret = -1;
            }
        } else if (IS_RELAXNG(nodes, "define")) {
            tmp = xmlRelaxNGParseDefine(ctxt, nodes);
            if (tmp != 0)
                ret = -1;
        } else if (IS_RELAXNG(nodes, "include")) {
            tmp = xmlRelaxNGParseInclude(ctxt, nodes);
            if (tmp != 0)
                ret = -1;
        } else {
            xmlRngPErr(ctxt, nodes, XML_RNGP_GRAMMAR_CONTENT,
                       "grammar has unexpected child %s\n", nodes->name,
                       NULL);
            ret = -1;
        }
        nodes = nodes->next;
    }
    return (ret);
}